

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_1d_test.cc
# Opt level: O0

void __thiscall
(anonymous_namespace)::BlendA64Mask1DTestHBD_RandomValues_Test::
~BlendA64Mask1DTestHBD_RandomValues_Test(BlendA64Mask1DTestHBD_RandomValues_Test *this)

{
  BlendA64Mask1DTestHBD_RandomValues_Test *in_stack_00000010;
  
  anon_unknown.dwarf_10310e3::BlendA64Mask1DTestHBD_RandomValues_Test::
  ~BlendA64Mask1DTestHBD_RandomValues_Test(in_stack_00000010);
  return;
}

Assistant:

TEST_P(BlendA64Mask1DTestHBD, RandomValues) {
  for (bit_depth_ = 8; bit_depth_ <= 12; bit_depth_ += 2) {
    for (int bsize = 0; bsize < BLOCK_SIZES_ALL; ++bsize) {
      const int hi = 1 << bit_depth_;

      for (int i = 0; i < kBufSize; ++i) {
        dst_ref_[i] = rng_(hi);
        dst_tst_[i] = rng_(hi);
        src0_[i] = rng_(hi);
        src1_[i] = rng_(hi);
      }

      for (int i = 0; i < kMaxMaskSize; ++i)
        mask_[i] = rng_(AOM_BLEND_A64_MAX_ALPHA + 1);

      Common(bsize);
    }
  }
}